

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_CutCreate(Mpm_Man_t *p,Mpm_Cut_t *pUni,Mpm_Cut_t **ppCut)

{
  int iVar1;
  int hCutNew;
  Mpm_Cut_t **ppCut_local;
  Mpm_Cut_t *pUni_local;
  Mpm_Man_t *p_local;
  
  iVar1 = Mpm_CutAlloc(p,*(uint *)&pUni->field_0x4 >> 0x1b,ppCut);
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfe000000 | *(uint *)&pUni->field_0x4 & 0x1ffffff;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff | (*(uint *)&pUni->field_0x4 >> 0x19 & 1) << 0x19;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfbffffff | (*(uint *)&pUni->field_0x4 >> 0x1a & 1) << 0x1a;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0x7ffffff | *(uint *)&pUni->field_0x4 & 0xf8000000;
  memcpy((*ppCut)->pLeaves,pUni->pLeaves,(ulong)(*(uint *)&pUni->field_0x4 >> 0x1b) << 2);
  return iVar1;
}

Assistant:

static inline int Mpm_CutCreate( Mpm_Man_t * p, Mpm_Cut_t * pUni, Mpm_Cut_t ** ppCut )  
{ 
    int hCutNew = Mpm_CutAlloc( p, pUni->nLeaves, ppCut );
    (*ppCut)->iFunc    = pUni->iFunc;
    (*ppCut)->fCompl   = pUni->fCompl;
    (*ppCut)->fUseless = pUni->fUseless;
    (*ppCut)->nLeaves  = pUni->nLeaves;
    memcpy( (*ppCut)->pLeaves, pUni->pLeaves, sizeof(int) * pUni->nLeaves );
    return hCutNew;
}